

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O0

int VP8IteratorNext(VP8EncIterator *it)

{
  int iVar1;
  int *in_RDI;
  
  iVar1 = *in_RDI;
  *in_RDI = iVar1 + 1;
  if (iVar1 + 1 == *(int *)(*(long *)(in_RDI + 10) + 0x30)) {
    in_RDI[1] = in_RDI[1] + 1;
    VP8IteratorSetRow(it,(int)((ulong)in_RDI >> 0x20));
  }
  else {
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 4;
    *(long *)(in_RDI + 0xc) = *(long *)(in_RDI + 0xc) + 4;
    *(long *)(in_RDI + 0x12) = *(long *)(in_RDI + 0x12) + 4;
    *(long *)(in_RDI + 0x60) = *(long *)(in_RDI + 0x60) + 0x10;
    *(long *)(in_RDI + 0x62) = *(long *)(in_RDI + 0x62) + 0x10;
  }
  iVar1 = in_RDI[0x53];
  in_RDI[0x53] = iVar1 + -1;
  return (int)(0 < iVar1 + -1);
}

Assistant:

int VP8IteratorNext(VP8EncIterator* const it) {
  if (++it->x == it->enc->mb_w) {
    VP8IteratorSetRow(it, ++it->y);
  } else {
    it->preds += 4;
    it->mb += 1;
    it->nz += 1;
    it->y_top += 16;
    it->uv_top += 16;
  }
  return (0 < --it->count_down);
}